

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nVal,
                    sqlite3_value **apVal)

{
  sqlite3_vtab_cursor *__s;
  sqlite3_uint64 n;
  uint uVar1;
  Fts5FullTable *pTab;
  Fts5Config *pConfig;
  char **ppcVar2;
  Fts5Cursor *pFVar3;
  Fts5Config *pConfig_00;
  long lVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  sqlite3_vtab *psVar9;
  uchar *zExpr;
  uchar *puVar10;
  char *pcVar11;
  sqlite3_vtab *ppStmt;
  char **pzErr;
  sqlite3_value *psVar12;
  sqlite3_value *pVal;
  ulong uVar13;
  uint uVar14;
  sqlite3_value *pVal_00;
  char *pcVar15;
  uint bDesc;
  sqlite3_vtab *psVar16;
  bool bVar17;
  bool bVar18;
  sqlite3_value *local_58;
  sqlite3_vtab_cursor local_48;
  char *zRank;
  char **local_38;
  
  pTab = (Fts5FullTable *)pCursor->pVtab;
  pConfig = (pTab->p).pConfig;
  ppcVar2 = pConfig->pzErrmsg;
  __s = pCursor + 4;
  if (*(int *)&pCursor[4].pVtab != 0) {
    fts5FreeCursorComponents((Fts5Cursor *)pCursor);
    memset(__s,0,0x98);
  }
  pzErr = &(pTab->p).base.zErrMsg;
  pConfig->pzErrmsg = pzErr;
  bVar17 = (idxNum & 1U) != 0;
  if (bVar17) {
    bVar18 = *apVal == (sqlite3_value *)0x0;
  }
  else {
    bVar18 = true;
  }
  if ((idxNum & 2U) == 0) {
    local_58 = (sqlite3_value *)0x0;
    uVar13 = (ulong)bVar17;
  }
  else {
    uVar13 = (ulong)(bVar17 + 1);
    local_58 = apVal[bVar17];
  }
  if ((idxNum & 4U) == 0) {
    psVar12 = (sqlite3_value *)0x0;
    uVar8 = uVar13;
  }
  else {
    uVar8 = (ulong)((int)uVar13 + 1);
    psVar12 = apVal[uVar13];
  }
  uVar14 = (uint)uVar8;
  if ((idxNum & 8U) == 0) {
    pVal_00 = (sqlite3_value *)0x0;
  }
  else {
    uVar14 = uVar14 + 1;
    pVal_00 = apVal[uVar8];
  }
  if ((idxNum & 0x10U) == 0) {
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = apVal[uVar14];
  }
  uVar14 = idxNum & 0x80;
  bDesc = uVar14 >> 7;
  *(uint *)((long)&pCursor[4].pVtab + 4) = bDesc;
  if (psVar12 != (sqlite3_value *)0x0) {
    pVal = psVar12;
    pVal_00 = psVar12;
  }
  local_38 = ppcVar2;
  psVar9 = (sqlite3_vtab *)fts5GetRowidLimit(pVal_00,0x7fffffffffffffff);
  pCursor[(ulong)(uVar14 == 0) + 5].pVtab = psVar9;
  psVar9 = (sqlite3_vtab *)fts5GetRowidLimit(pVal,-0x8000000000000000);
  pCursor[(ulong)bDesc + 5].pVtab = psVar9;
  pFVar3 = pTab->pSortCsr;
  if (pFVar3 != (Fts5Cursor *)0x0) {
    bVar17 = pFVar3->bDesc == 0;
    pCursor[6].pVtab = (sqlite3_vtab *)(&pFVar3->iFirstRowid)[bVar17];
    pCursor[5].pVtab = (sqlite3_vtab *)(&pFVar3->iFirstRowid)[!bVar17];
    *(undefined4 *)&pCursor[4].pVtab = 2;
    pCursor[8].pVtab = (sqlite3_vtab *)pFVar3->pExpr;
    iVar6 = fts5CursorFirst(pTab,(Fts5Cursor *)pCursor,bDesc);
    goto LAB_00188f0f;
  }
  if (bVar18) {
    if (pConfig->zContent != (char *)0x0) {
      *(uint *)&__s->pVtab = (psVar12 != (sqlite3_value *)0x0) + 5;
      if (psVar12 == (sqlite3_value *)0x0) {
        uVar14 = (uint)(*(int *)((long)&pCursor[4].pVtab + 4) != 0);
      }
      else {
        uVar14 = 2;
      }
      iVar6 = sqlite3Fts5StorageStmt(pTab->pStorage,uVar14,(sqlite3_stmt **)(pCursor + 7),pzErr);
      if (iVar6 == 0) {
        psVar9 = pCursor[7].pVtab;
        if (*(int *)&__s->pVtab == 6) {
          sqlite3_bind_value((sqlite3_stmt *)psVar9,1,*apVal);
        }
        else {
          sqlite3_bind_int64((sqlite3_stmt *)psVar9,1,(sqlite_int64)pCursor[5].pVtab);
          sqlite3_bind_int64((sqlite3_stmt *)pCursor[7].pVtab,2,(sqlite_int64)pCursor[6].pVtab);
        }
        iVar6 = fts5NextMethod(pCursor);
      }
      goto LAB_00188f0f;
    }
    pcVar11 = sqlite3_mprintf("%s: table does not support scanning",pConfig->zName);
    pzErr = pConfig->pzErrmsg;
LAB_00188edc:
    *pzErr = pcVar11;
  }
  else {
    zExpr = sqlite3_value_text(*apVal);
    if (zExpr == (uchar *)0x0) {
      zExpr = "";
    }
    if (local_58 == (sqlite3_value *)0x0) {
      if ((sqlite3_vtab *)pConfig->zRank == (sqlite3_vtab *)0x0) {
        pCursor[0xc].pVtab = (sqlite3_vtab *)"bm25";
        pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
      }
      else {
        pCursor[0xc].pVtab = (sqlite3_vtab *)pConfig->zRank;
        pCursor[0xd].pVtab = (sqlite3_vtab *)pConfig->zRankArgs;
      }
LAB_00188e1c:
      if (*zExpr != '*') {
        iVar6 = sqlite3Fts5ExprNew(pConfig,idxNum >> 0x10,(char *)zExpr,(Fts5Expr **)(pCursor + 8),
                                   pzErr);
        if (iVar6 == 0) {
          if ((idxNum & 0x20U) == 0) {
            *(undefined4 *)&pCursor[4].pVtab = 1;
            iVar6 = fts5CursorFirst(pTab,(Fts5Cursor *)pCursor,bDesc);
          }
          else {
            *(undefined4 *)&pCursor[4].pVtab = 4;
            if (pCursor[8].pVtab == (sqlite3_vtab *)0x0) {
              iVar6 = 0;
            }
            else {
              iVar6 = *(int *)((long)&pCursor[8].pVtab[1].pModule + 4);
            }
            pConfig_00 = (pTab->p).pConfig;
            psVar9 = pCursor[0xc].pVtab;
            psVar16 = pCursor[0xd].pVtab;
            n = (long)iVar6 * 4 + 0x1c;
            ppStmt = (sqlite3_vtab *)sqlite3_malloc64(n);
            if (ppStmt == (sqlite3_vtab *)0x0) {
              iVar6 = 7;
            }
            else {
              memset(ppStmt,0,n);
              pcVar11 = ", ";
              if (psVar16 == (sqlite3_vtab *)0x0) {
                pcVar11 = "";
                psVar16 = (sqlite3_vtab *)0x1c7aeb;
              }
              *(int *)&ppStmt[1].pModule = iVar6;
              pcVar15 = "DESC";
              if (uVar14 == 0) {
                pcVar15 = "ASC";
              }
              iVar7 = fts5PrepareStatement
                                ((sqlite3_stmt **)ppStmt,pConfig_00,pcVar11,pConfig_00->zDb,
                                 pConfig_00->zName,psVar9,pConfig_00->zName,pcVar11,psVar16,pcVar15)
              ;
              pCursor[9].pVtab = ppStmt;
              if (iVar7 == 0) {
                pTab->pSortCsr = (Fts5Cursor *)pCursor;
                iVar7 = fts5SorterNext((Fts5Cursor *)pCursor);
                pTab->pSortCsr = (Fts5Cursor *)0x0;
                iVar6 = 0;
                if (iVar7 == 0) goto LAB_00188f0f;
              }
              sqlite3_finalize((sqlite3_stmt *)ppStmt->pModule);
              sqlite3_free(ppStmt);
              pCursor[9].pVtab = (sqlite3_vtab *)0x0;
              iVar6 = iVar7;
            }
          }
        }
        goto LAB_00188f0f;
      }
      do {
        puVar10 = zExpr;
        bVar5 = puVar10[1];
        zExpr = puVar10 + 1;
      } while (bVar5 == 0x20);
      uVar13 = 0;
      while ((bVar5 & 0xdf) != 0) {
        lVar4 = uVar13 + 2;
        uVar13 = uVar13 + 1;
        bVar5 = puVar10[lVar4];
      }
      *(undefined4 *)&__s->pVtab = 3;
      iVar6 = sqlite3_strnicmp("reads",(char *)zExpr,(int)uVar13);
      if (iVar6 == 0) {
        psVar9 = (sqlite3_vtab *)(long)((pTab->p).pIndex)->nRead;
      }
      else {
        iVar6 = sqlite3_strnicmp("id",(char *)zExpr,(int)uVar13);
        if (iVar6 != 0) {
          pcVar11 = sqlite3_mprintf("unknown special query: %.*s",uVar13 & 0xffffffff,zExpr);
          goto LAB_00188edc;
        }
        psVar9 = pCursor[3].pVtab;
      }
      pCursor[0xb].pVtab = psVar9;
      iVar6 = 0;
      goto LAB_00188f0f;
    }
    puVar10 = sqlite3_value_text(local_58);
    zRank = (char *)0x0;
    local_48.pVtab = (sqlite3_vtab *)0x0;
    if (puVar10 == (uchar *)0x0) {
      uVar1._0_2_ = local_58->flags;
      uVar1._2_1_ = local_58->enc;
      uVar1._3_1_ = local_58->eSubtype;
      if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00188dd2;
    }
    else {
      iVar6 = sqlite3Fts5ConfigParseRank((char *)puVar10,&zRank,(char **)&local_48);
      if (iVar6 != 1) {
        if (iVar6 != 0) goto LAB_00188f0f;
LAB_00188dd2:
        pCursor[0xc].pVtab = (sqlite3_vtab *)zRank;
        pCursor[0xd].pVtab = local_48.pVtab;
        *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 0x10;
        goto LAB_00188e1c;
      }
    }
    pcVar11 = sqlite3_mprintf("parse error in rank function: %s",puVar10);
    pCursor->pVtab->zErrMsg = pcVar11;
  }
  iVar6 = 1;
LAB_00188f0f:
  pConfig->pzErrmsg = local_38;
  return iVar6;
}

Assistant:

static int fts5FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc = SQLITE_OK;             /* Error code */
  int iVal = 0;                   /* Counter for apVal[] */
  int bDesc;                      /* True if ORDER BY [rank|rowid] DESC */
  int bOrderByRank;               /* True if ORDER BY rank */
  sqlite3_value *pMatch = 0;      /* <tbl> MATCH ? expression (or NULL) */
  sqlite3_value *pRank = 0;       /* rank MATCH ? expression (or NULL) */
  sqlite3_value *pRowidEq = 0;    /* rowid = ? expression (or NULL) */
  sqlite3_value *pRowidLe = 0;    /* rowid <= ? expression (or NULL) */
  sqlite3_value *pRowidGe = 0;    /* rowid >= ? expression (or NULL) */
  int iCol;                       /* Column on LHS of MATCH operator */
  char **pzErrmsg = pConfig->pzErrmsg;

  UNUSED_PARAM(zUnused);
  UNUSED_PARAM(nVal);

  if( pCsr->ePlan ){
    fts5FreeCursorComponents(pCsr);
    memset(&pCsr->ePlan, 0, sizeof(Fts5Cursor) - ((u8*)&pCsr->ePlan-(u8*)pCsr));
  }

  assert( pCsr->pStmt==0 );
  assert( pCsr->pExpr==0 );
  assert( pCsr->csrflags==0 );
  assert( pCsr->pRank==0 );
  assert( pCsr->zRank==0 );
  assert( pCsr->zRankArgs==0 );

  assert( pzErrmsg==0 || pzErrmsg==&pTab->p.base.zErrMsg );
  pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Decode the arguments passed through to this function.
  **
  ** Note: The following set of if(...) statements must be in the same
  ** order as the corresponding entries in the struct at the top of
  ** fts5BestIndexMethod().  */
  if( BitFlagTest(idxNum, FTS5_BI_MATCH) ) pMatch = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_RANK) ) pRank = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_EQ) ) pRowidEq = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_LE) ) pRowidLe = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_GE) ) pRowidGe = apVal[iVal++];
  iCol = (idxNum>>16);
  assert( iCol>=0 && iCol<=pConfig->nCol );
  assert( iVal==nVal );
  bOrderByRank = ((idxNum & FTS5_BI_ORDER_RANK) ? 1 : 0);
  pCsr->bDesc = bDesc = ((idxNum & FTS5_BI_ORDER_DESC) ? 1 : 0);

  /* Set the cursor upper and lower rowid limits. Only some strategies 
  ** actually use them. This is ok, as the xBestIndex() method leaves the
  ** sqlite3_index_constraint.omit flag clear for range constraints
  ** on the rowid field.  */
  if( pRowidEq ){
    pRowidLe = pRowidGe = pRowidEq;
  }
  if( bDesc ){
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }else{
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }

  if( pTab->pSortCsr ){
    /* If pSortCsr is non-NULL, then this call is being made as part of 
    ** processing for a "... MATCH <expr> ORDER BY rank" query (ePlan is
    ** set to FTS5_PLAN_SORTED_MATCH). pSortCsr is the cursor that will
    ** return results to the user for this query. The current cursor 
    ** (pCursor) is used to execute the query issued by function 
    ** fts5CursorFirstSorted() above.  */
    assert( pRowidEq==0 && pRowidLe==0 && pRowidGe==0 && pRank==0 );
    assert( nVal==0 && pMatch==0 && bOrderByRank==0 && bDesc==0 );
    assert( pCsr->iLastRowid==LARGEST_INT64 );
    assert( pCsr->iFirstRowid==SMALLEST_INT64 );
    if( pTab->pSortCsr->bDesc ){
      pCsr->iLastRowid = pTab->pSortCsr->iFirstRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iLastRowid;
    }else{
      pCsr->iLastRowid = pTab->pSortCsr->iLastRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iFirstRowid;
    }
    pCsr->ePlan = FTS5_PLAN_SOURCE;
    pCsr->pExpr = pTab->pSortCsr->pExpr;
    rc = fts5CursorFirst(pTab, pCsr, bDesc);
  }else if( pMatch ){
    const char *zExpr = (const char*)sqlite3_value_text(apVal[0]);
    if( zExpr==0 ) zExpr = "";

    rc = fts5CursorParseRank(pConfig, pCsr, pRank);
    if( rc==SQLITE_OK ){
      if( zExpr[0]=='*' ){
        /* The user has issued a query of the form "MATCH '*...'". This
        ** indicates that the MATCH expression is not a full text query,
        ** but a request for an internal parameter.  */
        rc = fts5SpecialMatch(pTab, pCsr, &zExpr[1]);
      }else{
        char **pzErr = &pTab->p.base.zErrMsg;
        rc = sqlite3Fts5ExprNew(pConfig, iCol, zExpr, &pCsr->pExpr, pzErr);
        if( rc==SQLITE_OK ){
          if( bOrderByRank ){
            pCsr->ePlan = FTS5_PLAN_SORTED_MATCH;
            rc = fts5CursorFirstSorted(pTab, pCsr, bDesc);
          }else{
            pCsr->ePlan = FTS5_PLAN_MATCH;
            rc = fts5CursorFirst(pTab, pCsr, bDesc);
          }
        }
      }
    }
  }else if( pConfig->zContent==0 ){
    *pConfig->pzErrmsg = sqlite3_mprintf(
        "%s: table does not support scanning", pConfig->zName
    );
    rc = SQLITE_ERROR;
  }else{
    /* This is either a full-table scan (ePlan==FTS5_PLAN_SCAN) or a lookup
    ** by rowid (ePlan==FTS5_PLAN_ROWID).  */
    pCsr->ePlan = (pRowidEq ? FTS5_PLAN_ROWID : FTS5_PLAN_SCAN);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, fts5StmtType(pCsr), &pCsr->pStmt, &pTab->p.base.zErrMsg
    );
    if( rc==SQLITE_OK ){
      if( pCsr->ePlan==FTS5_PLAN_ROWID ){
        sqlite3_bind_value(pCsr->pStmt, 1, apVal[0]);
      }else{
        sqlite3_bind_int64(pCsr->pStmt, 1, pCsr->iFirstRowid);
        sqlite3_bind_int64(pCsr->pStmt, 2, pCsr->iLastRowid);
      }
      rc = fts5NextMethod(pCursor);
    }
  }

  pConfig->pzErrmsg = pzErrmsg;
  return rc;
}